

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O0

void ev_fork_stop(ev_loop *loop,ev_fork *w)

{
  int iVar1;
  int iVar2;
  int active;
  ev_fork *w_local;
  ev_loop *loop_local;
  
  clear_pending(loop,(W)w);
  if (w->active != 0) {
    iVar1 = w->active;
    iVar2 = loop->forkcnt + -1;
    loop->forkcnt = iVar2;
    loop->forks[iVar1 + -1] = loop->forks[iVar2];
    loop->forks[iVar1 + -1]->active = iVar1;
    ev_stop(loop,(W)w);
  }
  return;
}

Assistant:

void
ev_fork_stop (EV_P_ ev_fork *w) EV_THROW
{
  clear_pending (EV_A_ (W)w);
  if (expect_false (!ev_is_active (w)))
    return;

  EV_FREQUENT_CHECK;

  {
    int active = ev_active (w);

    forks [active - 1] = forks [--forkcnt];
    ev_active (forks [active - 1]) = active;
  }

  ev_stop (EV_A_ (W)w);

  EV_FREQUENT_CHECK;
}